

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> * __thiscall
spvtools::opt::LoopDescriptor::GetLoopsInBinaryLayoutOrder
          (vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
           *__return_storage_ptr__,LoopDescriptor *this)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  Loop *pLVar4;
  BasicBlock *pBVar5;
  Function *this_00;
  reference this_01;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  Loop *local_a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  uint *local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  element;
  uint32_t block_id;
  value_type *block;
  iterator __end3;
  iterator __begin3;
  Function *__range3;
  Function *function;
  ulong local_38;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  LoopDescriptor *this_local;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *loops;
  
  ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  memset(&i,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  for (local_38 = 0; uVar1 = local_38, sVar3 = NumLoops(this), uVar1 < sVar3;
      local_38 = local_38 + 1) {
    pLVar4 = GetLoopByIndex(this,local_38);
    pBVar5 = Loop::GetHeaderBlock(pLVar4);
    function._4_4_ = BasicBlock::id(pBVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
               (value_type_conflict2 *)((long)&function + 4));
  }
  function._3_1_ = 0;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::vector
            (__return_storage_ptr__);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  if (!bVar2) {
    pLVar4 = GetLoopByIndex(this,0);
    pBVar5 = Loop::GetHeaderBlock(pLVar4);
    this_00 = BasicBlock::GetParent(pBVar5);
    join_0x00000010_0x00000000_ = Function::begin(this_00);
    _block = Function::end(this_00);
    while (bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end3.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block), bVar2
          ) {
      this_01 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_
                          );
      element._M_current._4_4_ = BasicBlock::id(this_01);
      local_90._M_current =
           (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      local_98 = (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      local_88 = std::
                 find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                           (local_90,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      )local_98,(uint *)((long)&element._M_current + 4));
      local_a0._M_current =
           (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      bVar2 = __gnu_cxx::operator!=(&local_88,&local_a0);
      if (bVar2) {
        local_b0._M_current =
             (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
        sVar3 = __gnu_cxx::operator-(&local_88,&local_b0);
        local_a8 = GetLoopByIndex(this,sVar3);
        std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                  (__return_storage_ptr__,&local_a8);
      }
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
  }
  function._3_1_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Loop*> LoopDescriptor::GetLoopsInBinaryLayoutOrder() {
  std::vector<uint32_t> ids{};

  for (size_t i = 0; i < NumLoops(); ++i) {
    ids.push_back(GetLoopByIndex(i).GetHeaderBlock()->id());
  }

  std::vector<Loop*> loops{};
  if (!ids.empty()) {
    auto function = GetLoopByIndex(0).GetHeaderBlock()->GetParent();
    for (const auto& block : *function) {
      auto block_id = block.id();

      auto element = std::find(std::begin(ids), std::end(ids), block_id);
      if (element != std::end(ids)) {
        loops.push_back(&GetLoopByIndex(element - std::begin(ids)));
      }
    }
  }

  return loops;
}